

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

uint32 __thiscall google::protobuf::io::CodedInputStream::ReadTagFallback(CodedInputStream *this)

{
  uint8 uVar1;
  uint8 *puVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  uint uVar7;
  byte *pbVar8;
  uint64 uStack_10;
  int iVar6;
  
  pbVar8 = this->buffer_;
  iVar6 = (int)this->buffer_end_;
  iVar5 = iVar6 - (int)pbVar8;
  if ((iVar5 < 10) && ((iVar5 < 1 || ((char)this->buffer_end_[-1] < '\0')))) {
    if ((iVar6 == (int)pbVar8) &&
       (((0 < this->buffer_size_after_limit_ || (this->total_bytes_read_ == this->current_limit_))
        && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_))))
    {
      this->legitimate_message_end_ = true;
      return 0;
    }
    if ((this->buffer_ == this->buffer_end_) && (bVar3 = Refresh(this), !bVar3)) {
      if (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_) {
        this->legitimate_message_end_ = true;
      }
      else {
        this->legitimate_message_end_ = this->current_limit_ == this->total_bytes_limit_;
      }
      return 0;
    }
    uStack_10 = 0;
    puVar2 = this->buffer_;
    if ((puVar2 < this->buffer_end_) && (uVar1 = *puVar2, -1 < (long)(char)uVar1)) {
      this->buffer_ = puVar2 + 1;
      bVar3 = true;
      uStack_10 = (long)(char)uVar1;
    }
    else {
      bVar3 = ReadVarint64Fallback(this,&uStack_10);
    }
    uVar4 = 0;
    if (bVar3 != false) {
      uVar4 = (uint32)uStack_10;
    }
    return uVar4;
  }
  uVar7 = *pbVar8 & 0x7f;
  if ((char)*pbVar8 < '\0') {
    uVar7 = uVar7 | (pbVar8[1] & 0x7f) << 7;
    if ((char)pbVar8[1] < '\0') {
      uVar7 = uVar7 | (pbVar8[2] & 0x7f) << 0xe;
      if ((char)pbVar8[2] < '\0') {
        uVar7 = uVar7 | (pbVar8[3] & 0x7f) << 0x15;
        if ((char)pbVar8[3] < '\0') {
          uVar7 = uVar7 | (uint)pbVar8[4] << 0x1c;
          if ((char)pbVar8[4] < '\0') {
            pbVar8 = pbVar8 + 6;
            iVar5 = 5;
            do {
              if (-1 < (char)pbVar8[-1]) goto LAB_001c8735;
              pbVar8 = pbVar8 + 1;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
            pbVar8 = (byte *)0x0;
          }
          else {
            pbVar8 = pbVar8 + 5;
          }
        }
        else {
          pbVar8 = pbVar8 + 4;
        }
      }
      else {
        pbVar8 = pbVar8 + 3;
      }
    }
    else {
      pbVar8 = pbVar8 + 2;
    }
  }
  else {
    pbVar8 = pbVar8 + 1;
  }
LAB_001c8735:
  if (pbVar8 == (byte *)0x0) {
    return 0;
  }
  this->buffer_ = pbVar8;
  return uVar7;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return buffer_end_ - buffer_;
}